

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multihash.cpp
# Opt level: O3

OptError * __thiscall
multihash::decode_abi_cxx11_
          (OptError *__return_storage_ptr__,multihash *this,Bytes *buf,Multihash *m)

{
  undefined8 *puVar1;
  long lVar2;
  long lVar3;
  pointer puVar4;
  pointer puVar5;
  _Head_base<0UL,_unsigned_int,_false> code;
  long lVar6;
  long lVar7;
  Bytes *extraout_RDX;
  Bytes *extraout_RDX_00;
  Bytes *buf_00;
  bool bVar8;
  OptError err;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_a0;
  bool local_80;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_78;
  pointer local_58;
  _Head_base<0UL,_unsigned_int,_false> local_50;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_48;
  
  if ((ulong)(*(long *)(this + 8) - *(long *)this) < 2) {
    (__return_storage_ptr__->
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    )._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_payload._M_value._M_dataplus._M_p =
         (pointer)((long)&(__return_storage_ptr__->
                          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                          )._M_payload.
                          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                          .
                          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ._M_payload + 0x10);
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,errTooShort_abi_cxx11_,
               DAT_0014c728 + errTooShort_abi_cxx11_);
    (__return_storage_ptr__->
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    )._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_engaged = true;
    return __return_storage_ptr__;
  }
  local_80 = false;
  binary::uvarint_abi_cxx11_
            ((tuple<unsigned_int,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_78,(binary *)this,buf);
  code._M_head_impl = local_50._M_head_impl;
  std::
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::_M_move_assign((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_a0,
                   (_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_78);
  buf_00 = extraout_RDX;
  if ((local_58._0_1_ == true) &&
     (local_58 = (pointer)((ulong)local_58 & 0xffffffffffffff00),
     local_78._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_78._M_value + 0x10))) {
    operator_delete((void *)local_78._M_value._M_dataplus._M_p,(ulong)(local_78._16_8_ + 1));
    buf_00 = extraout_RDX_00;
  }
  if (local_80 == true) {
LAB_00110836:
    puVar1 = (undefined8 *)
             ((long)&(__return_storage_ptr__->
                     super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                     )._M_payload.
                     super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                     .
                     super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ._M_payload + 0x10);
    *(undefined8 **)
     &(__return_storage_ptr__->
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      )._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_payload = puVar1;
    if (local_a0._M_value._M_dataplus._M_p == (_Alloc_hider)((long)&local_a0._M_value + 0x10)) {
      *puVar1 = CONCAT71(local_a0._17_7_,local_a0._16_1_);
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->
               super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
               )._M_payload.
               super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
               .
               super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ._M_payload + 0x18) = local_a0._24_8_;
    }
    else {
      (__return_storage_ptr__->
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      )._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_payload._M_value._M_dataplus._M_p = (pointer)local_a0._M_value._M_dataplus._M_p;
      *(ulong *)((long)&(__return_storage_ptr__->
                        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                        )._M_payload.
                        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                        .
                        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ._M_payload + 0x10) = CONCAT71(local_a0._17_7_,local_a0._16_1_);
    }
    (__return_storage_ptr__->
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    )._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_payload._M_value._M_string_length = local_a0._M_value._M_string_length;
    local_a0._M_value._M_string_length = 0;
    local_a0._16_1_ = 0;
    local_a0._M_value._M_dataplus._M_p = (_Alloc_hider)((long)&local_a0._M_value + 0x10);
  }
  else {
    binary::uvarint_abi_cxx11_
              ((tuple<unsigned_int,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_78,(binary *)this,buf_00);
    std::
    _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_M_move_assign((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_a0,
                     (_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_78);
    if ((local_58._0_1_ == true) &&
       (local_58 = (pointer)((ulong)local_58 & 0xffffffffffffff00),
       local_78._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_78._M_value + 0x10))) {
      operator_delete((void *)local_78._M_value._M_dataplus._M_p,(ulong)(local_78._16_8_ + 1));
    }
    if (local_80 == true) goto LAB_00110836;
    lVar2 = *(long *)(this + 8);
    lVar3 = *(long *)this;
    if (lVar2 - lVar3 == (ulong)local_50._M_head_impl) {
      if (hash_by_code._16_8_ != 0) {
        lVar6 = 0x14c7e8;
        lVar7 = hash_by_code._16_8_;
        do {
          bVar8 = *(uint *)(lVar7 + 0x20) < code._M_head_impl;
          if (!bVar8) {
            lVar6 = lVar7;
          }
          lVar7 = *(long *)(lVar7 + 0x10 + (ulong)bVar8 * 8);
        } while (lVar7 != 0);
        if ((lVar6 != 0x14c7e8) && (*(uint *)(lVar6 + 0x20) <= code._M_head_impl)) {
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                    (&local_48,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)this);
          Multihash::Multihash((Multihash *)&local_78,code._M_head_impl,lVar2 - lVar3,&local_48);
          *(undefined4 *)
           &(buf->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
            super__Vector_impl_data._M_finish = local_78._M_value._M_string_length._0_4_;
          (buf->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
          super__Vector_impl_data._M_start = (pointer)local_78._M_value._M_dataplus._M_p;
          puVar4 = (buf->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
          puVar5 = buf[1].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          (buf->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)local_78._16_8_;
          buf[1].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)local_78._24_8_;
          buf[1].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish = local_58;
          local_78._16_8_ = (pointer)0x0;
          local_78._24_8_ = (pointer)0x0;
          local_58 = (pointer)0x0;
          if ((puVar4 != (pointer)0x0) &&
             (operator_delete(puVar4,(long)puVar5 - (long)puVar4),
             (pointer)local_78._16_8_ != (pointer)0x0)) {
            operator_delete((void *)local_78._16_8_,(long)local_58 - local_78._16_8_);
          }
          if (local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_48.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_48.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_48.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          (__return_storage_ptr__->
          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
          )._M_payload.
          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ._M_engaged = false;
          goto LAB_0011087f;
        }
      }
      (__return_storage_ptr__->
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      )._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_payload._M_value._M_dataplus._M_p =
           (pointer)((long)&(__return_storage_ptr__->
                            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                            )._M_payload.
                            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                            .
                            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ._M_payload + 0x10);
      std::__cxx11::string::_M_construct<char*>
                ((string *)__return_storage_ptr__,errUnknownHashCode_abi_cxx11_,
                 DAT_0014c708 + errUnknownHashCode_abi_cxx11_);
    }
    else {
      (__return_storage_ptr__->
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      )._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_payload._M_value._M_dataplus._M_p =
           (pointer)((long)&(__return_storage_ptr__->
                            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                            )._M_payload.
                            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                            .
                            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ._M_payload + 0x10);
      std::__cxx11::string::_M_construct<char*>
                ((string *)__return_storage_ptr__,errInconsistantLength_abi_cxx11_,
                 DAT_0014c7a8 + errInconsistantLength_abi_cxx11_);
    }
  }
  (__return_storage_ptr__->
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  )._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_engaged = true;
LAB_0011087f:
  if ((local_80 == true) &&
     (local_80 = false,
     local_a0._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_a0._M_value + 0x10))) {
    operator_delete((void *)local_a0._M_value._M_dataplus._M_p,
                    CONCAT71(local_a0._17_7_,local_a0._16_1_) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

OptError decode(Bytes &buf, Multihash &m) {
	if (buf.size() < 2) {
		return errTooShort;
	}

	UInt code{};
	UInt length{};
	OptError err{};

	std::tie(code, err) = binary::uvarint(buf);
	if (err) {
		return err;
	}

	std::tie(length, err) = binary::uvarint(buf);
	if (err) {
		return err;
	}

	if (buf.size() != length) {
		return errInconsistantLength;
	}

	if (!validate(code)) {
		return errUnknownHashCode;
	}

	m = Multihash{code, length, buf};
	return std::nullopt;
}